

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O2

int sp_zgemv(char *trans,doublecomplex alpha,SuperMatrix *A,doublecomplex *x,int incx,
            doublecomplex beta,doublecomplex *y,int incy)

{
  undefined8 *puVar1;
  long lVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  uint uVar9;
  double dVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  doublecomplex *pdVar19;
  long lVar20;
  uint uVar21;
  double *pdVar22;
  ulong uVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  char msg [256];
  
  dVar26 = alpha.i;
  dVar25 = alpha.r;
  dVar27 = beta.i;
  dVar29 = beta.r;
  bVar12 = *trans + 0xbd;
  if ((bVar12 < 0x2c) && ((0x80000020801U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) {
    uVar23 = 0xffffffdfffe >> (bVar12 & 0x3f);
    uVar21 = A->nrow;
    if (-1 < (int)uVar21) {
      uVar4 = A->ncol;
      lVar13 = (long)(int)uVar4;
      if (-1 < lVar13) {
        if (incx == 0) {
          msg[0] = '\x05';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
        }
        else {
          if (incy != 0) {
            if (uVar4 == 0 || uVar21 == 0) {
              return 0;
            }
            pvVar7 = A->Store;
            lVar8 = *(long *)((long)pvVar7 + 8);
            if ((((dVar25 == 0.0 && dVar26 == 0.0) && (dVar29 == 1.0)) && (!NAN(dVar29))) &&
               ((dVar27 == 0.0 && (!NAN(dVar27))))) {
              return 0;
            }
            uVar9 = uVar4;
            if ((uVar23 & 1) == 0) {
              uVar9 = uVar21;
              uVar21 = uVar4;
            }
            uVar4 = (1 - uVar9) * incx;
            if (0 < incx) {
              uVar4 = 0;
            }
            uVar15 = (ulong)uVar4;
            uVar4 = (1 - uVar21) * incy;
            if (0 < incy) {
              uVar4 = 0;
            }
            lVar20 = (long)(int)uVar4;
            lVar18 = (long)incy;
            if (((dVar29 != 1.0) || (NAN(dVar29))) || ((dVar27 != 0.0 || (NAN(dVar27))))) {
              if (incy == 1) {
                if (dVar29 != 0.0 || dVar27 != 0.0) {
                  for (lVar11 = 0; (ulong)uVar21 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
                    dVar28 = *(double *)((long)&y->r + lVar11);
                    dVar3 = *(double *)((long)&y->i + lVar11);
                    pdVar22 = (double *)((long)&y->r + lVar11);
                    *pdVar22 = dVar28 * dVar29 + -dVar3 * dVar27;
                    pdVar22[1] = dVar28 * dVar27 + dVar3 * dVar29;
                  }
                }
                else {
                  for (lVar11 = 0; (ulong)uVar21 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
                    puVar1 = (undefined8 *)((long)&y->r + lVar11);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                  }
                }
              }
              else if (dVar29 != 0.0 || dVar27 != 0.0) {
                pdVar19 = y + lVar20;
                while (bVar24 = uVar21 != 0, uVar21 = uVar21 - 1, bVar24) {
                  dVar28 = pdVar19->r;
                  pdVar19->r = dVar28 * dVar29 + -pdVar19->i * dVar27;
                  pdVar19->i = dVar28 * dVar27 + pdVar19->i * dVar29;
                  pdVar19 = pdVar19 + lVar18;
                }
              }
              else {
                pdVar19 = y + lVar20;
                while (bVar24 = uVar21 != 0, uVar21 = uVar21 - 1, bVar24) {
                  pdVar19->r = 0.0;
                  pdVar19->i = 0.0;
                  pdVar19 = pdVar19 + lVar18;
                }
              }
            }
            if (dVar25 == 0.0 && dVar26 == 0.0) {
              return 0;
            }
            if ((uVar23 & 1) == 0) {
              if ((byte)(*trans | 0x20U) == 0x74) {
                if (incx == 1) {
                  lVar11 = (long)(int)uVar4;
                  lVar20 = *(long *)((long)pvVar7 + 0x18);
                  lVar17 = 0;
                  while (lVar17 != lVar13) {
                    lVar16 = (long)*(int *)(lVar20 + lVar17 * 4);
                    lVar2 = lVar17 * 4;
                    lVar17 = lVar17 + 1;
                    pdVar22 = (double *)(lVar16 * 0x10 + lVar8);
                    dVar29 = 0.0;
                    dVar27 = 0.0;
                    for (; lVar16 < *(int *)(lVar20 + 4 + lVar2); lVar16 = lVar16 + 1) {
                      iVar5 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar16 * 4);
                      dVar29 = dVar29 + x[iVar5].r * *pdVar22 + -pdVar22[1] * x[iVar5].i;
                      dVar27 = dVar27 + x[iVar5].r * pdVar22[1] + *pdVar22 * x[iVar5].i;
                      pdVar22 = pdVar22 + 2;
                    }
                    y[lVar11].r = y[lVar11].r + dVar29 * dVar25 + -dVar27 * dVar26;
                    y[lVar11].i = y[lVar11].i + dVar29 * dVar26 + dVar27 * dVar25;
                    lVar11 = lVar11 + lVar18;
                  }
                  return 0;
                }
                uVar14 = 0x23d;
              }
              else {
                if (incx == 1) {
                  lVar11 = *(long *)((long)pvVar7 + 0x18);
                  lVar17 = 0;
                  while (lVar17 != lVar13) {
                    lVar16 = (long)*(int *)(lVar11 + lVar17 * 4);
                    lVar2 = lVar17 * 4;
                    lVar17 = lVar17 + 1;
                    pdVar22 = (double *)(lVar16 * 0x10 + lVar8);
                    dVar29 = 0.0;
                    dVar27 = 0.0;
                    for (; lVar16 < *(int *)(lVar11 + 4 + lVar2); lVar16 = lVar16 + 1) {
                      iVar5 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar16 * 4);
                      dVar29 = dVar29 + x[iVar5].r * -pdVar22[1] + x[iVar5].i * *pdVar22;
                      dVar27 = dVar27 + x[iVar5].r * *pdVar22 + x[iVar5].i * pdVar22[1];
                      pdVar22 = pdVar22 + 2;
                    }
                    y[lVar20].r = y[lVar20].r + dVar27 * dVar25 + -dVar29 * dVar26;
                    y[lVar20].i = y[lVar20].i + dVar27 * dVar26 + dVar29 * dVar25;
                    lVar20 = lVar20 + lVar18;
                  }
                  return 0;
                }
                uVar14 = 0x252;
              }
            }
            else {
              if (incy == 1) {
                for (lVar18 = 0; lVar18 != lVar13; lVar18 = lVar18 + 1) {
                  dVar29 = x[uVar15].r;
                  dVar27 = x[uVar15].i;
                  if ((((dVar29 != 0.0) || (NAN(dVar29))) || (dVar27 != 0.0)) || (NAN(dVar27))) {
                    dVar28 = dVar29 * dVar25 + -dVar27 * dVar26;
                    dVar29 = dVar29 * dVar26 + dVar27 * dVar25;
                    lVar20 = (long)*(int *)(*(long *)((long)pvVar7 + 0x18) + lVar18 * 4);
                    iVar5 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar18 * 4);
                    pdVar22 = (double *)(lVar20 * 0x10 + lVar8 + 8);
                    for (; lVar20 < iVar5; lVar20 = lVar20 + 1) {
                      iVar6 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar20 * 4);
                      dVar27 = pdVar22[-1];
                      dVar3 = *pdVar22;
                      dVar10 = y[iVar6].i;
                      y[iVar6].r = y[iVar6].r + dVar27 * dVar28 + dVar3 * -dVar29;
                      y[iVar6].i = dVar10 + dVar27 * dVar29 + dVar3 * dVar28;
                      pdVar22 = pdVar22 + 2;
                    }
                  }
                  uVar15 = uVar15 + (long)incx;
                }
                return 0;
              }
              uVar14 = 0x22b;
            }
            sprintf(msg,"%s at line %d in file %s\n","Not implemented.",uVar14,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
                   );
            superlu_abort_and_exit(msg);
          }
          msg[0] = '\b';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
        }
        goto LAB_0011bf7f;
      }
    }
    msg[0] = '\x03';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
  }
  else {
    msg[0] = '\x01';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
  }
LAB_0011bf7f:
  input_error("sp_zgemv ",(int *)msg);
  return 0;
}

Assistant:

int
sp_zgemv(char *trans, doublecomplex alpha, SuperMatrix *A, doublecomplex *x, 
	 int incx, doublecomplex beta, doublecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int info;
    doublecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    doublecomplex comp_zero = {0.0, 0.0};
    doublecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_zgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (z_eq(&alpha, &comp_zero) && z_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !z_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  zz_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( z_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    zz_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( z_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !z_eq(&x[jx], &comp_zero) ) {
		    zz_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			zz_mult(&temp1, &temp,  &Aval[i]);
			z_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    zz_mult(&temp1, &Aval[i], &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	doublecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    zz_mult(&temp1, &temp2, &x[irow]);
		    z_add(&temp, &temp, &temp1);
		}
		zz_mult(&temp1, &alpha, &temp);
		z_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}